

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

leveldb * __thiscall leveldb::CurrentFileName(leveldb *this,string *dbname)

{
  string *dbname_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)dbname);
  return this;
}

Assistant:

std::string CurrentFileName(const std::string &dbname) {
        return dbname + "/CURRENT";
    }